

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::MaybeSnapshotClocksIntoRingBuffer
          (TracingServiceImpl *this,TracingSession *tracing_session)

{
  bool bVar1;
  TraceConfig_BuiltinDataSource *this_00;
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  *__x;
  CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  *this_01;
  size_t sVar2;
  CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  *snapshot_buffer;
  undefined1 local_30 [7];
  bool did_update;
  ClockSnapshotData snapshot;
  TracingSession *tracing_session_local;
  TracingServiceImpl *this_local;
  
  snapshot.
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tracing_session;
  this_00 = protos::gen::TraceConfig::builtin_data_sources(&tracing_session->config);
  bVar1 = protos::gen::TraceConfig_BuiltinDataSource::disable_clock_snapshotting(this_00);
  if (!bVar1) {
    bVar1 = perfetto::base::
            CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
            ::empty((CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                     *)(snapshot.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x2c));
    if (bVar1) {
      memset(local_30,0,0x18);
      std::
      vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
      ::vector((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                *)local_30);
    }
    else {
      __x = perfetto::base::
            CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
            ::back((CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                    *)(snapshot.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x2c));
      std::
      vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
      ::vector((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                *)local_30,__x);
    }
    bVar1 = SnapshotClocks(this,(ClockSnapshotData *)local_30);
    if (bVar1) {
      this_01 = (CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                 *)(snapshot.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x2c);
      sVar2 = perfetto::base::
              CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
              ::size(this_01);
      if (0xf < sVar2) {
        sVar2 = perfetto::base::
                CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                ::size(this_01);
        perfetto::base::
        CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
        ::erase_front(this_01,sVar2 - 0xf);
      }
      perfetto::base::
      CircularQueue<std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>
      ::
      emplace_back<std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>
                ((CircularQueue<std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>
                  *)this_01,
                 (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  *)local_30);
    }
    std::
    vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
    ::~vector((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
               *)local_30);
  }
  return;
}

Assistant:

void TracingServiceImpl::MaybeSnapshotClocksIntoRingBuffer(
    TracingSession* tracing_session) {
  if (tracing_session->config.builtin_data_sources()
          .disable_clock_snapshotting()) {
    return;
  }

  // We are making an explicit copy of the latest snapshot (if it exists)
  // because SnapshotClocks reads this data and computes the drift based on its
  // content. If the clock drift is high enough, it will update the contents of
  // |snapshot| and return true. Otherwise, it will return false.
  TracingSession::ClockSnapshotData snapshot =
      tracing_session->clock_snapshot_ring_buffer.empty()
          ? TracingSession::ClockSnapshotData()
          : tracing_session->clock_snapshot_ring_buffer.back();
  bool did_update = SnapshotClocks(&snapshot);
  if (did_update) {
    // This means clocks drifted enough since last snapshot. See the comment
    // in SnapshotClocks.
    auto* snapshot_buffer = &tracing_session->clock_snapshot_ring_buffer;

    // Erase before emplacing to prevent a unncessary doubling of memory if
    // not needed.
    static constexpr uint32_t kClockSnapshotRingBufferSize = 16;
    if (snapshot_buffer->size() >= kClockSnapshotRingBufferSize) {
      snapshot_buffer->erase_front(1 + snapshot_buffer->size() -
                                   kClockSnapshotRingBufferSize);
    }
    snapshot_buffer->emplace_back(std::move(snapshot));
  }
}